

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

string * __thiscall
ot::commissioner::TimePointToString_abi_cxx11_
          (string *__return_storage_ptr__,commissioner *this,TimePoint *aTimePoint)

{
  _Put_time<char> __f;
  time_t time;
  stringstream ss;
  tm localTime;
  long local_1e0;
  stringstream local_1d8 [16];
  basic_ostream<char,_std::char_traits<char>_> local_1c8 [112];
  ios_base local_158 [264];
  tm local_50;
  
  local_1e0 = *(long *)this / 1000000000;
  std::__cxx11::stringstream::stringstream(local_1d8);
  localtime_r(&local_1e0,&local_50);
  __f._M_fmt = "%Y-%m-%d %H:%M:%S";
  __f._M_tmb = (tm *)&local_50;
  std::operator<<(local_1c8,__f);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1d8);
  std::ios_base::~ios_base(local_158);
  return __return_storage_ptr__;
}

Assistant:

std::string TimePointToString(const TimePoint &aTimePoint)
{
    struct tm         localTime;
    std::time_t       time = Clock::to_time_t(aTimePoint);
    std::stringstream ss;

    localtime_r(&time, &localTime);
    ss << std::put_time(&localTime, "%Y-%m-%d %H:%M:%S");
    return ss.str();
}